

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shuff.hpp
# Opt level: O0

void shuff_decompress(uint32_t *out_u32,size_t to_decode,uint8_t *in_u8,size_t cSrcSize)

{
  undefined8 uVar1;
  byte bVar2;
  ulong *puVar3;
  uint64_t uVar4;
  uint64_t *__ptr;
  bit_io_t *max_cw_length;
  uint64_t uVar5;
  uint64_t *puVar6;
  ulong *puVar7;
  long lVar8;
  long in_RSI;
  int *in_RDI;
  uint64_t *start_linear_search;
  uint64_t *lj;
  uint64_t currlen;
  uint64_t currcode;
  uint64_t bits_needed;
  uint64_t code;
  int i_2;
  int64_t start;
  uint64_t S;
  uint64_t from;
  uint64_t t;
  int64_t *p_1;
  int i_1;
  uint64_t min_cw_len;
  int64_t *p;
  int i;
  uint64_t max_cw_len;
  int64_t *lens;
  uint64_t n;
  uint64_t cw_lens [64];
  uint64_t *mapping;
  bit_io_t bio;
  bit_io_t *in_stack_fffffffffffffd00;
  bit_io_t *in_stack_fffffffffffffd08;
  ulong *local_2e8;
  ulong local_2c8;
  ulong local_2b8;
  undefined8 local_2b0;
  ulong local_2a8;
  uint64_t in_stack_fffffffffffffd60;
  uint64_t *in_stack_fffffffffffffd68;
  undefined4 in_stack_fffffffffffffd70;
  undefined4 in_stack_fffffffffffffd74;
  int iVar9;
  ulong local_288;
  uint64_t *local_280;
  int local_274;
  uint64_t local_258 [65];
  void *local_50;
  bit_io_t local_48;
  uint8_t *local_18;
  long local_10;
  int *local_8;
  
  local_10 = in_RSI;
  local_8 = in_RDI;
  bit_io_t::bit_io_t(&local_48);
  SHUFF_START_INPUT(&local_48,&local_18);
  local_50 = shuff_allocate((size_t)in_stack_fffffffffffffd00);
  uVar4 = SHUFF_INPUT_ULONG(in_stack_fffffffffffffd08,(int64_t)in_stack_fffffffffffffd00);
  __ptr = (uint64_t *)shuff_allocate((size_t)in_stack_fffffffffffffd00);
  max_cw_length =
       (bit_io_t *)SHUFF_INPUT_ULONG(in_stack_fffffffffffffd08,(int64_t)in_stack_fffffffffffffd00);
  for (local_274 = 0; local_280 = __ptr, local_274 <= (int)max_cw_length; local_274 = local_274 + 1)
  {
    local_258[local_274] = 0;
  }
  for (; local_280 < __ptr + uVar4; local_280 = local_280 + 1) {
    in_stack_fffffffffffffd08 = max_cw_length;
    uVar5 = SHUFF_INPUT_UNARY_CODE(in_stack_fffffffffffffd00);
    *local_280 = (long)in_stack_fffffffffffffd08 - uVar5;
    local_258[*local_280] = local_258[*local_280] + 1;
  }
  for (local_288 = 0; local_258[local_288] == 0; local_288 = local_288 + 1) {
  }
  shuff_build_canonical_arrays(local_258,(uint64_t)max_cw_length);
  shuff_interp_decode((bit_io_t *)CONCAT44(in_stack_fffffffffffffd74,in_stack_fffffffffffffd70),
                      in_stack_fffffffffffffd68,in_stack_fffffffffffffd60);
  for (iVar9 = 1; (long)iVar9 <= (long)max_cw_length; iVar9 = iVar9 + 1) {
    local_258[iVar9] = local_258[iVar9 + -1] + local_258[iVar9];
  }
  puVar6 = __ptr + uVar4;
  while (puVar6 = puVar6 + -1, __ptr <= puVar6) {
    uVar5 = local_258[*puVar6 - 1];
    local_258[*puVar6 - 1] = uVar5 + 1;
    *puVar6 = uVar5;
  }
  local_2b8 = 0;
  __ptr[uVar4] = 1;
  while (local_2b8 < uVar4) {
    local_2a8 = local_2b8;
    local_2b0 = *(undefined8 *)((long)local_50 + local_2b8 * 8);
    while (-1 < (long)__ptr[local_2a8]) {
      iVar9 = (int)__ptr[local_2a8];
      __ptr[local_2a8] = 0xffffffffffffffff;
      uVar1 = *(undefined8 *)((long)local_50 + (long)iVar9 * 8);
      *(undefined8 *)((long)local_50 + (long)iVar9 * 8) = local_2b0;
      local_2b0 = uVar1;
      local_2a8 = (ulong)iVar9;
    }
    for (; __ptr[local_2b8] == 0xffffffffffffffff; local_2b8 = local_2b8 + 1) {
    }
  }
  free(__ptr);
  shuff_build_lut((uint64_t)max_cw_length);
  local_2c8 = 0;
  if (local_288 < 9) {
    local_288 = 8;
  }
  puVar7 = &DAT_002128d8 + local_288;
  for (; local_10 != 0; local_10 = local_10 + -1) {
    uVar4 = SHUFF_INPUT_ULONG(in_stack_fffffffffffffd08,local_288);
    local_2c8 = uVar4 | local_2c8;
    local_2e8 = puVar7;
    puVar3 = shuff_lut[local_2c8 >> 0x38];
    if (shuff_lut[local_2c8 >> 0x38] == (ulong *)0x0) {
      for (; puVar3 = local_2e8, local_2c8 < *local_2e8; local_2e8 = local_2e8 + 1) {
      }
    }
    local_2e8 = puVar3;
    lVar8 = (long)(local_2e8 + -0x4251c) >> 3;
    bVar2 = (char)lVar8 + 1;
    *local_8 = (int)*(undefined8 *)
                     ((long)local_50 +
                     (shuff_offset[lVar8] +
                     ((local_2c8 >> (0x40 - bVar2 & 0x3f)) - shuff_min_code[lVar8])) * 8) + -1;
    local_2c8 = local_2c8 << (bVar2 & 0x3f);
    local_8 = local_8 + 1;
  }
  free(local_50);
  return;
}

Assistant:

void shuff_decompress(
    uint32_t* out_u32, size_t to_decode, const uint8_t* in_u8, size_t cSrcSize)
{
    bit_io_t bio;
    SHUFF_START_INPUT(&bio, in_u8);
    uint64_t* mapping
        = (uint64_t*)shuff_allocate(sizeof(uint64_t) * SHUFF_MAX_SYMBOL);
    uint64_t cw_lens[SHUFF_L + 1];

    uint64_t n = SHUFF_INPUT_ULONG(&bio, SHUFF_LOG2_MAX_SYMBOL);
    int64_t* lens = (int64_t*)shuff_allocate(sizeof(int64_t) * n + 1);

    uint64_t max_cw_len = SHUFF_INPUT_ULONG(&bio, SHUFF_LOG2_L);

    for (int i = 0; i <= (int)max_cw_len; i++)
        cw_lens[i] = 0;
    for (int64_t* p = lens; p < lens + n; p++) {
        *p = max_cw_len - SHUFF_INPUT_UNARY_CODE(&bio);
        cw_lens[*p]++;
    }

    uint64_t min_cw_len = 0;
    for (min_cw_len = 0; cw_lens[min_cw_len] == 0; min_cw_len++)
        ;

    shuff_build_canonical_arrays(cw_lens, max_cw_len);

    shuff_interp_decode(&bio, mapping, n);

    for (int i = 1; i <= (int64_t)max_cw_len; i++)
        cw_lens[i] += cw_lens[i - 1];

    for (int64_t* p = lens + n - 1; p >= lens; p--)
        *p = cw_lens[*p - 1]++;

    uint64_t t, from, S;
    int64_t start = 0;
    lens[n] = 1; // sentinel
    while (start < n) {
        from = start;
        S = mapping[start];

        while (lens[from] >= 0) {
            int i = lens[from];
            lens[from] = -1;
            t = mapping[i];
            mapping[i] = S;
            S = t;
            from = i;
        }

        while (lens[start] == -1)
            start++; // find next start (if any)
    }
    free(lens);

    shuff_build_lut(max_cw_len);

    uint64_t code = 0;
    uint64_t bits_needed = sizeof(uint64_t) << 3;
    uint64_t currcode;
    uint64_t currlen = sizeof(uint64_t) << 3;
    uint64_t* lj;
    uint64_t* start_linear_search
        = shuff_lj_base + SHUFF_MAX(SHUFF_LUT_BITS, min_cw_len) - 1;

    while (to_decode != 0) {
        code |= SHUFF_INPUT_ULONG(&bio, bits_needed);

        lj = shuff_lut[code >> ((sizeof(uint64_t) << 3) - SHUFF_LUT_BITS)];
        if (lj == NULL)
            for (lj = start_linear_search; code < *lj; lj++)
                ;
        currlen = lj - shuff_lj_base + 1;

        // calculate symbol number
        currcode = code >> ((sizeof(uint64_t) << 3) - currlen);
        currcode -= shuff_min_code[currlen - 1];
        currcode += shuff_offset[currlen - 1];

        // subtract the one added in encoding
        *out_u32++ = mapping[currcode] - 1; // we add 1 to everything we encode

        code <<= currlen;
        bits_needed = currlen;
        to_decode--;
    }

    free(mapping);
}